

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuStepOneOp(sqlite3rbu *p,int eType)

{
  int iVar1;
  char *pcVar2;
  sqlite3_value *psVar3;
  int local_34;
  sqlite3_stmt *psStack_30;
  int i;
  sqlite3_stmt *pWriter;
  sqlite3_value *pVal;
  RbuObjIter *pIter;
  int eType_local;
  sqlite3rbu *p_local;
  
  if (eType == 2) {
    p->nPhaseOneStep = p->nPhaseOneStep - (long)(p->objiter).nIndex;
  }
  if ((eType == 4) || (eType == 2)) {
    psStack_30 = (p->objiter).pDelete;
  }
  else {
    psStack_30 = (p->objiter).pInsert;
  }
  local_34 = 0;
  while( true ) {
    if ((p->objiter).nCol <= local_34) {
      if (((p->objiter).zIdx == (char *)0x0) &&
         ((((p->objiter).eType == 5 || ((p->objiter).eType == 1)) ||
          (((p->objiter).eType == 3 && (p->zTarget == (char *)0x0)))))) {
        psVar3 = sqlite3_column_value((p->objiter).pSelect,(p->objiter).nCol + 1);
        iVar1 = sqlite3_bind_value(psStack_30,(p->objiter).nCol + 1,psVar3);
        p->rc = iVar1;
      }
      if (p->rc == 0) {
        sqlite3_step(psStack_30);
        iVar1 = resetAndCollectError(psStack_30,&p->zErrmsg);
        p->rc = iVar1;
      }
      return;
    }
    if ((((eType == 1) && ((p->objiter).zIdx == (char *)0x0)) && ((p->objiter).eType == 2)) &&
       (((p->objiter).abTblPk[local_34] != '\0' &&
        (iVar1 = sqlite3_column_type((p->objiter).pSelect,local_34), iVar1 == 5)))) break;
    if ((eType != 2) || ((p->objiter).abTblPk[local_34] != '\0')) {
      psVar3 = sqlite3_column_value((p->objiter).pSelect,local_34);
      iVar1 = sqlite3_bind_value(psStack_30,local_34 + 1,psVar3);
      p->rc = iVar1;
      if (p->rc != 0) {
        return;
      }
    }
    local_34 = local_34 + 1;
  }
  p->rc = 0x14;
  pcVar2 = sqlite3_mprintf("datatype mismatch");
  p->zErrmsg = pcVar2;
  return;
}

Assistant:

static void rbuStepOneOp(sqlite3rbu *p, int eType){
  RbuObjIter *pIter = &p->objiter;
  sqlite3_value *pVal;
  sqlite3_stmt *pWriter;
  int i;

  assert( p->rc==SQLITE_OK );
  assert( eType!=RBU_DELETE || pIter->zIdx==0 );
  assert( eType==RBU_DELETE || eType==RBU_IDX_DELETE
       || eType==RBU_INSERT || eType==RBU_IDX_INSERT
  );

  /* If this is a delete, decrement nPhaseOneStep by nIndex. If the DELETE
  ** statement below does actually delete a row, nPhaseOneStep will be
  ** incremented by the same amount when SQL function rbu_tmp_insert()
  ** is invoked by the trigger.  */
  if( eType==RBU_DELETE ){
    p->nPhaseOneStep -= p->objiter.nIndex;
  }

  if( eType==RBU_IDX_DELETE || eType==RBU_DELETE ){
    pWriter = pIter->pDelete;
  }else{
    pWriter = pIter->pInsert;
  }

  for(i=0; i<pIter->nCol; i++){
    /* If this is an INSERT into a table b-tree and the table has an
    ** explicit INTEGER PRIMARY KEY, check that this is not an attempt
    ** to write a NULL into the IPK column. That is not permitted.  */
    if( eType==RBU_INSERT 
     && pIter->zIdx==0 && pIter->eType==RBU_PK_IPK && pIter->abTblPk[i] 
     && sqlite3_column_type(pIter->pSelect, i)==SQLITE_NULL
    ){
      p->rc = SQLITE_MISMATCH;
      p->zErrmsg = sqlite3_mprintf("datatype mismatch");
      return;
    }

    if( eType==RBU_DELETE && pIter->abTblPk[i]==0 ){
      continue;
    }

    pVal = sqlite3_column_value(pIter->pSelect, i);
    p->rc = sqlite3_bind_value(pWriter, i+1, pVal);
    if( p->rc ) return;
  }
  if( pIter->zIdx==0 ){
    if( pIter->eType==RBU_PK_VTAB 
     || pIter->eType==RBU_PK_NONE 
     || (pIter->eType==RBU_PK_EXTERNAL && rbuIsVacuum(p)) 
    ){
      /* For a virtual table, or a table with no primary key, the 
      ** SELECT statement is:
      **
      **   SELECT <cols>, rbu_control, rbu_rowid FROM ....
      **
      ** Hence column_value(pIter->nCol+1).
      */
      assertColumnName(pIter->pSelect, pIter->nCol+1, 
          rbuIsVacuum(p) ? "rowid" : "rbu_rowid"
      );
      pVal = sqlite3_column_value(pIter->pSelect, pIter->nCol+1);
      p->rc = sqlite3_bind_value(pWriter, pIter->nCol+1, pVal);
    }
  }
  if( p->rc==SQLITE_OK ){
    sqlite3_step(pWriter);
    p->rc = resetAndCollectError(pWriter, &p->zErrmsg);
  }
}